

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O1

void __thiscall Pager::_flush(Pager *this,uint32_t pageNum)

{
  __off_t _Var1;
  ssize_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  
  if (this->pages[pageNum] == (char *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Tried to flush null page. Exiting...");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    _Var1 = lseek(this->fileDescriptor,(ulong)(pageNum << 0xc),0);
    if (_Var1 == -1) {
      pcVar4 = "Error seeking file. Exiting... \n";
    }
    else {
      sVar2 = write(this->fileDescriptor,this->pages[pageNum],0x1000);
      if (sVar2 != -1) {
        return;
      }
      pcVar4 = "Error writing to file. Exiting...\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar4);
  }
  exit(1);
}

Assistant:

void Pager::_flush(uint32_t pageNum) {
	if (pages[pageNum] == nullptr) {
		std::cout << "Tried to flush null page. Exiting..." << std::endl;
		exit(EXIT_FAILURE);
	}

	off_t offset = lseek(fileDescriptor, pageNum * PAGE_SIZE, SEEK_SET);
	if (offset == -1) {
		std::cout << "Error seeking file. Exiting... \n";
		exit(EXIT_FAILURE);
	}

	ssize_t numOfBytesWritten = write(fileDescriptor, pages[pageNum], PAGE_SIZE);
	if (numOfBytesWritten == -1) {
		std::cout << "Error writing to file. Exiting...\n";
		exit(EXIT_FAILURE);
	}
}